

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 *puVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  char cVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  
  iVar4 = outch + 7;
  if (-1 < outch) {
    iVar4 = outch;
  }
  cVar14 = (char)(outch % 8);
  iVar8 = 0;
  Mat::create(kernel_tm,kernel_size * 8,inch,
              outch % 4 + (iVar4 >> 3) + (int)((char)(((byte)(cVar14 >> 7) >> 6) + cVar14) >> 2),4,
              (Allocator *)0x0);
  uVar3 = outch >> 3;
  if (0 < (int)uVar3) {
    iVar6 = kernel_size * inch;
    sVar1 = kernel_tm->cstep;
    sVar2 = kernel_tm->elemsize;
    pvVar11 = kernel_tm->data;
    iVar13 = iVar6 * 8;
    local_7c = iVar6 * 7;
    iVar7 = iVar6 * 2;
    local_80 = iVar6 * 6;
    local_84 = iVar6 * 5;
    local_88 = iVar6 * 4;
    iVar4 = iVar6 * 3;
    uVar12 = 0;
    iVar18 = iVar6;
    do {
      if (0 < iVar6) {
        lVar10 = 0;
        iVar17 = iVar6;
        do {
          *(undefined4 *)((long)pvVar11 + lVar10 * 8) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)iVar8 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 4) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)iVar18 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 8) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)iVar7 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 0xc) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)iVar4 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 0x10) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)local_88 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 0x14) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)local_84 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 0x18) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)local_80 * 4);
          *(undefined4 *)((long)pvVar11 + lVar10 * 8 + 0x1c) =
               *(undefined4 *)((long)&_kernel->data + lVar10 + (long)local_7c * 4);
          lVar10 = lVar10 + 4;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar12 = uVar12 + 1;
      pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
      local_7c = local_7c + iVar13;
      local_80 = local_80 + iVar13;
      local_84 = local_84 + iVar13;
      local_88 = local_88 + iVar13;
      iVar4 = iVar4 + iVar13;
      iVar7 = iVar7 + iVar13;
      iVar18 = iVar18 + iVar13;
      iVar8 = iVar8 + iVar13;
    } while (uVar12 != uVar3);
  }
  uVar5 = outch & 0xfffffff8;
  if ((((uint)outch >> 2 & 1) != 0) && (iVar4 = kernel_size * inch, 0 < iVar4)) {
    puVar9 = (undefined4 *)
             ((long)(int)uVar3 * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    lVar10 = 0;
    do {
      *puVar9 = *(undefined4 *)((long)&_kernel->data + lVar10 * 4 + (long)(int)(iVar4 * uVar5) * 4);
      puVar9[1] = *(undefined4 *)
                   ((long)&_kernel->data + lVar10 * 4 + (long)(int)((uVar5 + 1) * iVar4) * 4);
      puVar9[2] = *(undefined4 *)
                   ((long)&_kernel->data + lVar10 * 4 + (long)(int)((uVar5 + 2) * iVar4) * 4);
      puVar9[3] = *(undefined4 *)
                   ((long)&_kernel->data + lVar10 * 4 + (long)(int)((uVar5 + 3) * iVar4) * 4);
      lVar10 = lVar10 + 1;
      puVar9 = puVar9 + 4;
    } while (iVar4 != (int)lVar10);
  }
  iVar4 = uVar5 + ((uint)outch >> 2 & 1) * 4;
  if (iVar4 < outch) {
    iVar8 = kernel_size * inch;
    pvVar11 = kernel_tm->data;
    sVar1 = kernel_tm->cstep;
    sVar2 = kernel_tm->elemsize;
    lVar10 = (long)iVar4;
    iVar4 = iVar8 * iVar4;
    do {
      if (0 < iVar8) {
        uVar3 = (uint)lVar10;
        uVar15 = uVar3 + 7;
        uVar5 = uVar3 + 3;
        if (-1 < (int)uVar3) {
          uVar15 = uVar3;
          uVar5 = uVar3;
        }
        cVar14 = (char)lVar10 - ((byte)uVar15 & 0xf8);
        lVar16 = 0;
        do {
          *(undefined4 *)
           ((long)pvVar11 +
           lVar16 * 4 +
           (long)(int)((int)((char)(((byte)(cVar14 >> 7) >> 6) + cVar14) >> 2) +
                      ((int)uVar15 >> 3) + (uVar3 - (uVar5 & 0xfffffffc))) * sVar1 * sVar2) =
               *(undefined4 *)((long)&_kernel->data + lVar16 * 4 + (long)iVar4 * 4);
          lVar16 = lVar16 + 1;
        } while (iVar8 != (int)lVar16);
      }
      lVar10 = lVar10 + 1;
      iVar4 = iVar4 + iVar8;
    } while (lVar10 < outch);
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 4 x 4
    kernel_tm.create(4 * kernel_size, inch, outch / 4 + outch % 4);

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;
    remain_outch_start = nn_outch << 2;

    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        const float* k0 = kernel + (p + 0) * inch * kernel_size;
        const float* k1 = kernel + (p + 1) * inch * kernel_size;
        const float* k2 = kernel + (p + 2) * inch * kernel_size;
        const float* k3 = kernel + (p + 3) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }

    for (int p = remain_outch_start; p < outch; p++)
    {
        const float* k0 = kernel + (p + 0) * inch * kernel_size;

        float* ktmp = kernel_tm.channel(p / 4 + p % 4);

        for (int q = 0; q < inch * kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}